

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUIListBox * __thiscall
irr::gui::CGUIEnvironment::addListBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id,bool drawBackground
          )

{
  int *piVar1;
  int iVar2;
  CGUIListBox *this_00;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IGUISkin *pIVar4;
  undefined8 uVar5;
  IGUIElement *parent_00;
  undefined4 extraout_var_02;
  
  this_00 = (CGUIListBox *)operator_new(0x1d0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIListBox::CGUIListBox
            (this_00,&this->super_IGUIEnvironment,parent_00,id,*rectangle,true,drawBackground,false)
  ;
  if (this->CurrentSkin == (IGUISkin *)0x0) {
LAB_0021a9db:
    iVar2 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    if (CONCAT44(extraout_var_00,iVar2) == 0) goto LAB_0021aa2e;
    iVar2 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    if (iVar2 != 0) goto LAB_0021aa2e;
    iVar2 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
    pIVar4 = (IGUISkin *)CONCAT44(extraout_var_02,iVar2);
    lVar3 = 0x58;
  }
  else {
    iVar2 = (*this->CurrentSkin->_vptr_IGUISkin[8])();
    if (CONCAT44(extraout_var,iVar2) == 0) goto LAB_0021a9db;
    pIVar4 = this->CurrentSkin;
    lVar3 = 0x40;
  }
  uVar5 = (**(code **)((long)pIVar4->_vptr_IGUISkin + lVar3))();
  (**(code **)(*(long *)this_00 + 0x158))(this_00,uVar5);
LAB_0021aa2e:
  lVar3 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar3);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar3) + 8))();
  }
  return (IGUIListBox *)this_00;
}

Assistant:

IGUIListBox *CGUIEnvironment::addListBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id, bool drawBackground)
{
	IGUIListBox *b = new CGUIListBox(this, parent ? parent : this, id, rectangle,
			true, drawBackground, false);

	if (CurrentSkin && CurrentSkin->getSpriteBank()) {
		b->setSpriteBank(CurrentSkin->getSpriteBank());
	} else if (getBuiltInFont() && getBuiltInFont()->getType() == EGFT_BITMAP) {
		b->setSpriteBank(((IGUIFontBitmap *)getBuiltInFont())->getSpriteBank());
	}

	b->drop();
	return b;
}